

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O1

void av1_lowbd_inv_txfm2d_add_avx2
               (int32_t *input,uint8_t *output,int stride,TX_TYPE tx_type,TX_SIZE tx_size,int eob)

{
  undefined2 uVar1;
  char cVar2;
  uint uVar3;
  transform_1d_avx2 p_Var4;
  char *pcVar5;
  undefined8 uVar6;
  byte *pbVar7;
  transform_1d_avx2 p_Var8;
  __m256i alVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  longlong lVar12;
  longlong lVar13;
  longlong lVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  uint uVar21;
  uint uVar22;
  undefined1 (*pauVar23) [32];
  undefined1 (*pauVar24) [32];
  __m256i *palVar25;
  undefined1 *puVar26;
  ulong uVar27;
  int iVar28;
  undefined8 *puVar29;
  long lVar30;
  ulong uVar31;
  uint uVar32;
  int iVar33;
  int iVar34;
  ulong uVar35;
  __m256i *out;
  __m256i *palVar36;
  uint uVar37;
  int iVar38;
  long lVar39;
  undefined1 (*pauVar40) [16];
  byte bVar41;
  undefined7 in_register_00000081;
  long lVar42;
  int iVar43;
  uint uVar44;
  int iVar45;
  undefined8 *puVar46;
  uint uVar47;
  ulong uVar48;
  bool bVar49;
  bool bVar50;
  undefined2 uVar51;
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  __m128i alVar70;
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  __m256i buf0 [64];
  __m128i buf1 [8];
  int local_8be8;
  undefined1 (*local_8bd0) [32];
  undefined1 local_8ba0;
  undefined1 uStack_8b9f;
  undefined2 uStack_8b9e;
  short sStack_8b9c;
  short sStack_8b7c;
  ulong local_8b60;
  int local_8b00;
  undefined2 local_8ae0;
  short sStack_8ade;
  short sStack_8adc;
  undefined1 local_8aa0 [32];
  undefined1 local_8a80 [32];
  undefined1 local_8a60 [32];
  undefined1 local_8a40 [32];
  undefined1 local_8a20 [32];
  undefined1 local_8a00 [1920];
  longlong alStack_8280 [68];
  undefined1 local_8060 [32];
  undefined1 local_8040 [32];
  undefined1 local_8020 [32];
  undefined1 local_8000 [1022] [32];
  undefined1 auVar78 [32];
  undefined1 auVar81 [32];
  undefined1 auVar86 [32];
  
  uVar47 = (uint)CONCAT71(in_register_00000081,tx_size);
  if (uVar47 < 0x11) {
    if ((0x1e1e1U >> (uVar47 & 0x1f) & 1) != 0) goto switchD_004304df_default;
    if (uVar47 == 1) {
      if (tx_type < 0x10) {
        uVar47 = (uint)tx_type;
        if ((0x5400U >> (uVar47 & 0x1f) & 1) != 0) {
          av1_lowbd_inv_txfm2d_add_h_identity_ssse3(input,output,stride,tx_type,tx_size,eob);
          return;
        }
        if ((0xa800U >> (uVar47 & 0x1f) & 1) != 0) {
          av1_lowbd_inv_txfm2d_add_v_identity_ssse3(input,output,stride,tx_type,tx_size,eob);
          return;
        }
        if (uVar47 == 9) {
          av1_lowbd_inv_txfm2d_add_idtx_ssse3(input,output,stride,tx_size);
          return;
        }
      }
      bVar41 = ""[tx_type];
      bVar49 = 8 < tx_type;
      uVar47 = 0xaf >> (tx_type & 0x1f);
      pcVar5 = av1_inv_txfm_shift_ls[tx_size];
      auVar71 = vpackssdw_avx2(*(undefined1 (*) [32])input,*(undefined1 (*) [32])(input + 8));
      auVar74 = vpackssdw_avx2(*(undefined1 (*) [32])(input + 0x10),
                               *(undefined1 (*) [32])(input + 0x18));
      auVar69 = vpackssdw_avx2(*(undefined1 (*) [32])(input + 0x20),
                               *(undefined1 (*) [32])(input + 0x28));
      auVar88 = vpackssdw_avx2(*(undefined1 (*) [32])(input + 0x30),
                               *(undefined1 (*) [32])(input + 0x38));
      local_8a60 = vpermq_avx2(auVar71,0xd8);
      local_8a40 = vpermq_avx2(auVar74,0xd8);
      local_8a20 = vpermq_avx2(auVar69,0xd8);
      local_8a00._0_32_ = vpermq_avx2(auVar88,0xd8);
      (*lowbd_txfm_all_1d_zeros_8x8_arr[""[tx_type]][eob != 1])
                ((__m128i *)local_8a60,(__m128i *)local_8a60);
      bVar50 = (0x11fU >> (tx_type & 0x1f) & 1) == 0;
      alVar70 = (__m128i)local_8a60._0_16_;
      if (bVar50 && !bVar49) {
        alVar70 = (__m128i)local_8a00._16_16_;
      }
      auVar65 = local_8a20._0_16_;
      if (bVar50 && !bVar49) {
        auVar65 = local_8a40._16_16_;
      }
      auVar76 = local_8a60._16_16_;
      if (bVar50 && !bVar49) {
        auVar76 = local_8a00._0_16_;
      }
      auVar77 = local_8a00._0_16_;
      auVar80 = local_8a40._0_16_;
      auVar79 = local_8a20._16_16_;
      if (bVar50 && !bVar49) {
        auVar77 = local_8a60._16_16_;
        auVar80 = local_8a20._16_16_;
        auVar79 = local_8a40._0_16_;
      }
      uVar51 = (undefined2)(1 << (*pcVar5 + 0xfU & 0x1f));
      auVar88._2_2_ = uVar51;
      auVar88._0_2_ = uVar51;
      auVar88._4_2_ = uVar51;
      auVar88._6_2_ = uVar51;
      auVar88._8_2_ = uVar51;
      auVar88._10_2_ = uVar51;
      auVar88._12_2_ = uVar51;
      auVar88._14_2_ = uVar51;
      auVar88._16_2_ = uVar51;
      auVar88._18_2_ = uVar51;
      auVar88._20_2_ = uVar51;
      auVar88._22_2_ = uVar51;
      auVar88._24_2_ = uVar51;
      auVar88._26_2_ = uVar51;
      auVar88._28_2_ = uVar51;
      auVar88._30_2_ = uVar51;
      auVar71._0_16_ = ZEXT116(0) * auVar65 + ZEXT116(1) * (undefined1  [16])alVar70;
      auVar71._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar65;
      auVar74._0_16_ = ZEXT116(0) * auVar79 + ZEXT116(1) * auVar76;
      auVar74._16_16_ = ZEXT116(1) * auVar79;
      auVar69._0_16_ = ZEXT116(0) * auVar77 + ZEXT116(1) * auVar80;
      auVar69._16_16_ = ZEXT116(1) * auVar77;
      alVar70 = (__m128i)local_8a00._16_16_;
      auVar65 = local_8a40._16_16_;
      if (bVar50 && !bVar49) {
        alVar70 = (__m128i)local_8a60._0_16_;
        auVar65 = local_8a20._0_16_;
      }
      auVar52._0_16_ = ZEXT116(0) * (undefined1  [16])alVar70 + ZEXT116(1) * auVar65;
      auVar52._16_16_ = ZEXT116(1) * (undefined1  [16])alVar70;
      auVar71 = vpmulhrsw_avx2(auVar71,auVar88);
      auVar74 = vpmulhrsw_avx2(auVar74,auVar88);
      auVar69 = vpmulhrsw_avx2(auVar69,auVar88);
      auVar88 = vpmulhrsw_avx2(auVar52,auVar88);
      auVar52 = vpunpcklwd_avx2(auVar71,auVar74);
      auVar71 = vpunpckhwd_avx2(auVar71,auVar74);
      auVar53 = vpunpcklwd_avx2(auVar69,auVar88);
      auVar74 = vpunpckhwd_avx2(auVar69,auVar88);
      auVar69 = vpunpckldq_avx2(auVar52,auVar53);
      local_8060 = vpermq_avx2(auVar69,0xd8);
      auVar69 = vpunpckhdq_avx2(auVar52,auVar53);
      local_8040 = vpermq_avx2(auVar69,0xd8);
      auVar69 = vpunpckldq_avx2(auVar71,auVar74);
      local_8020 = vpermq_avx2(auVar69,0xd8);
      auVar71 = vpunpckhdq_avx2(auVar71,auVar74);
      local_8000[0] = vpermq_avx2(auVar71,0xd8);
      (*lowbd_txfm_all_1d_zeros_8x8_arr[bVar41][eob != 1])
                ((__m128i *)local_8060,(__m128i *)local_8060);
      uVar22 = ((byte)((byte)uVar47 | bVar49) & 1) - 1 | 1;
      iVar38 = 7;
      pauVar23 = local_8000;
      if ((uVar47 & 1) != 0 || bVar49) {
        iVar38 = 0;
        pauVar23 = (undefined1 (*) [32])(local_8060 + 0x10);
      }
      iVar28 = iVar38 + uVar22 * 2;
      auVar61._0_16_ =
           ZEXT116(0) * *(undefined1 (*) [16])*pauVar23 +
           ZEXT116(1) * *(undefined1 (*) [16])(local_8060 + (uint)(iVar38 << 4));
      auVar61._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
           ZEXT116(1) * *(undefined1 (*) [16])*pauVar23;
      iVar38 = iVar28 + uVar22 * 2;
      auVar67._0_16_ =
           ZEXT116(0) * *(undefined1 (*) [16])(local_8060 + (long)(int)(iVar28 + uVar22) * 0x10) +
           ZEXT116(1) * *(undefined1 (*) [16])(local_8060 + (long)iVar28 * 0x10);
      auVar67._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
           ZEXT116(1) * *(undefined1 (*) [16])(local_8060 + (long)(int)(iVar28 + uVar22) * 0x10);
      iVar28 = iVar38 + uVar22 * 2;
      auVar68._0_16_ =
           ZEXT116(0) * *(undefined1 (*) [16])(local_8060 + (long)(int)(iVar38 + uVar22) * 0x10) +
           ZEXT116(1) * *(undefined1 (*) [16])(local_8060 + (long)iVar38 * 0x10);
      auVar68._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
           ZEXT116(1) * *(undefined1 (*) [16])(local_8060 + (long)(int)(iVar38 + uVar22) * 0x10);
      auVar53._0_2_ = (undefined2)(1 << (pcVar5[1] + 0xfU & 0x1f));
      auVar53._2_2_ = auVar53._0_2_;
      auVar53._4_2_ = auVar53._0_2_;
      auVar53._6_2_ = auVar53._0_2_;
      auVar53._8_2_ = auVar53._0_2_;
      auVar53._10_2_ = auVar53._0_2_;
      auVar53._12_2_ = auVar53._0_2_;
      auVar53._14_2_ = auVar53._0_2_;
      auVar53._16_2_ = auVar53._0_2_;
      auVar53._18_2_ = auVar53._0_2_;
      auVar53._20_2_ = auVar53._0_2_;
      auVar53._22_2_ = auVar53._0_2_;
      auVar53._24_2_ = auVar53._0_2_;
      auVar53._26_2_ = auVar53._0_2_;
      auVar53._28_2_ = auVar53._0_2_;
      auVar53._30_2_ = auVar53._0_2_;
      auVar72._0_16_ =
           ZEXT116(0) * *(undefined1 (*) [16])(local_8060 + (long)(int)(iVar28 + uVar22) * 0x10) +
           ZEXT116(1) * *(undefined1 (*) [16])(local_8060 + (long)iVar28 * 0x10);
      auVar72._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
           ZEXT116(1) * *(undefined1 (*) [16])(local_8060 + (long)(int)(iVar28 + uVar22) * 0x10);
      auVar71 = vpmulhrsw_avx2(auVar61,auVar53);
      auVar74 = vpmulhrsw_avx2(auVar67,auVar53);
      auVar69 = vpmulhrsw_avx2(auVar68,auVar53);
      auVar88 = vpmulhrsw_avx2(auVar72,auVar53);
      lVar39 = (long)stride;
      auVar65._8_8_ = 0;
      auVar65._0_8_ = *(ulong *)(output + lVar39);
      auVar76._8_8_ = 0;
      auVar76._0_8_ = *(ulong *)output;
      auVar73._0_16_ = ZEXT116(0) * auVar65 + ZEXT116(1) * auVar76;
      auVar73._16_16_ = ZEXT116(1) * auVar65;
      auVar77._8_8_ = 0;
      auVar77._0_8_ = *(ulong *)(output + lVar39 * 3);
      auVar79._8_8_ = 0;
      auVar79._0_8_ = *(ulong *)(output + lVar39 * 2);
      auVar78._0_16_ = ZEXT116(0) * auVar77 + ZEXT116(1) * auVar79;
      auVar78._16_16_ = ZEXT116(1) * auVar77;
      auVar80._8_8_ = 0;
      auVar80._0_8_ = *(ulong *)(output + lVar39 * 5);
      auVar84._8_8_ = 0;
      auVar84._0_8_ = *(ulong *)(output + lVar39 * 4);
      auVar81._0_16_ = ZEXT116(0) * auVar80 + ZEXT116(1) * auVar84;
      auVar81._16_16_ = ZEXT116(1) * auVar80;
      auVar85._8_8_ = 0;
      auVar85._0_8_ = *(ulong *)(output + lVar39 * 7);
      auVar87._8_8_ = 0;
      auVar87._0_8_ = *(ulong *)(output + lVar39 * 6);
      auVar86._0_16_ = ZEXT116(0) * auVar85 + ZEXT116(1) * auVar87;
      auVar86._16_16_ = ZEXT116(1) * auVar85;
      auVar52 = vpunpcklbw_avx2(auVar73,ZEXT1632((undefined1  [16])0x0));
      auVar71 = vpaddsw_avx2(auVar71,auVar52);
      auVar52 = vpunpcklbw_avx2(auVar78,ZEXT1632((undefined1  [16])0x0));
      auVar74 = vpaddsw_avx2(auVar74,auVar52);
      auVar71 = vpackuswb_avx2(auVar71,auVar74);
      auVar74 = vpunpcklbw_avx2(auVar81,ZEXT1632((undefined1  [16])0x0));
      auVar74 = vpaddsw_avx2(auVar69,auVar74);
      auVar69 = vpunpcklbw_avx2(auVar86,ZEXT1632((undefined1  [16])0x0));
      auVar69 = vpaddsw_avx2(auVar88,auVar69);
      *(long *)output = auVar71._0_8_;
      *(long *)(output + lVar39) = auVar71._16_8_;
      uVar6 = vpextrq_avx(auVar71._0_16_,1);
      *(undefined8 *)(output + lVar39 * 2) = uVar6;
      uVar6 = vpextrq_avx(auVar71._16_16_,1);
      *(undefined8 *)(output + lVar39 * 3) = uVar6;
      auVar71 = vpackuswb_avx2(auVar74,auVar69);
      *(long *)(output + lVar39 * 4) = auVar71._0_8_;
      *(long *)(output + lVar39 * 5) = auVar71._16_8_;
      uVar6 = vpextrq_avx(auVar71._0_16_,1);
      *(undefined8 *)(output + lVar39 * 6) = uVar6;
      uVar6 = vpextrq_avx(auVar71._16_16_,1);
      *(undefined8 *)(output + lVar39 * 7) = uVar6;
      return;
    }
  }
  uVar27 = (ulong)tx_type;
  switch(uVar27) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
    break;
  case 9:
    uVar27 = (ulong)((uint)tx_size * 4);
    iVar38 = *(int *)((long)tx_size_wide + uVar27);
    iVar28 = *(int *)((long)tx_size_high + uVar27);
    iVar33 = 0x20;
    if (iVar38 < 0x20) {
      iVar33 = iVar38;
    }
    iVar43 = 0x20;
    if (iVar28 < 0x20) {
      iVar43 = iVar28;
    }
    iVar45 = 0;
    if (iVar38 != iVar28) {
      if (iVar28 < iVar38) {
        iVar45 = 1;
        if ((iVar28 * 2 == iVar38) || (iVar45 = 2, iVar28 << 2 == iVar38)) goto LAB_004317af;
      }
      else {
        iVar45 = -1;
        if ((iVar38 * 2 == iVar28) || (iVar45 = -2, iVar38 << 2 == iVar28)) goto LAB_004317af;
      }
      iVar45 = 0;
    }
LAB_004317af:
    if (iVar33 >> 4 < 1) {
      return;
    }
    pcVar5 = av1_inv_txfm_shift_ls[tx_size];
    iVar38 = *(int *)((long)tx_size_wide_log2 + uVar27);
    iVar28 = *(int *)((long)tx_size_high_log2 + uVar27);
    sStack_8b9c = (short)(iVar28 >> 0x1f);
    lVar39 = (long)iVar43 * 4;
    local_8b60 = 0;
    auVar75._8_2_ = 0x5a80;
    auVar75._0_8_ = 0x5a805a805a805a80;
    auVar75._10_2_ = 0x5a80;
    auVar75._12_2_ = 0x5a80;
    auVar75._14_2_ = 0x5a80;
    auVar75._16_2_ = 0x5a80;
    auVar75._18_2_ = 0x5a80;
    auVar75._20_2_ = 0x5a80;
    auVar75._22_2_ = 0x5a80;
    auVar75._24_2_ = 0x5a80;
    auVar75._26_2_ = 0x5a80;
    auVar75._28_2_ = 0x5a80;
    auVar75._30_2_ = 0x5a80;
    auVar83._8_2_ = 1;
    auVar83._0_8_ = 0x1000100010001;
    auVar83._10_2_ = 1;
    auVar83._12_2_ = 1;
    auVar83._14_2_ = 1;
    auVar83._16_2_ = 1;
    auVar83._18_2_ = 1;
    auVar83._20_2_ = 1;
    auVar83._22_2_ = 1;
    auVar83._24_2_ = 1;
    auVar83._26_2_ = 1;
    auVar83._28_2_ = 1;
    auVar83._30_2_ = 1;
    auVar58._8_2_ = 0x800;
    auVar58._0_8_ = 0x800080008000800;
    auVar58._10_2_ = 0x800;
    auVar58._12_2_ = 0x800;
    auVar58._14_2_ = 0x800;
    auVar58._16_2_ = 0x800;
    auVar58._18_2_ = 0x800;
    auVar58._20_2_ = 0x800;
    auVar58._22_2_ = 0x800;
    auVar58._24_2_ = 0x800;
    auVar58._26_2_ = 0x800;
    auVar58._28_2_ = 0x800;
    auVar58._30_2_ = 0x800;
    local_8bd0 = (undefined1 (*) [32])input;
    do {
      if (0 < iVar43 >> 4) {
        uVar51 = (undefined2)tx_size_high_log2[(long)iVar38 + 0x12];
        uVar27 = 0;
        pauVar23 = local_8bd0;
        do {
          cVar2 = *pcVar5;
          uVar47 = 0xc - (int)cVar2;
          auVar18._2_2_ = uVar51;
          auVar18._0_2_ = uVar51;
          auVar18._4_2_ = uVar51;
          auVar18._6_2_ = uVar51;
          auVar18._8_2_ = uVar51;
          auVar18._10_2_ = uVar51;
          auVar18._12_2_ = uVar51;
          auVar18._14_2_ = uVar51;
          auVar65 = vpunpcklwd_avx(auVar18,ZEXT416((1 << (0xbU - cVar2 & 0x1f)) + 0x800));
          auVar59._0_4_ = auVar65._0_4_;
          auVar59._4_4_ = auVar59._0_4_;
          auVar59._8_4_ = auVar59._0_4_;
          auVar59._12_4_ = auVar59._0_4_;
          auVar59._16_4_ = auVar59._0_4_;
          auVar59._20_4_ = auVar59._0_4_;
          auVar59._24_4_ = auVar59._0_4_;
          auVar59._28_4_ = auVar59._0_4_;
          if ((iVar45 == -1) || (iVar45 == 1)) {
            lVar30 = 0;
            pauVar24 = pauVar23;
            do {
              auVar71 = vlddqu_avx(*pauVar24);
              auVar71 = vpackssdw_avx2(auVar71,pauVar24[1]);
              auVar71 = vpermq_avx2(auVar71,0xd8);
              auVar71 = vpmulhrsw_avx2(auVar71,auVar75);
              auVar74 = vpunpcklwd_avx2(auVar71,auVar83);
              auVar69 = vpunpckhwd_avx2(auVar71,auVar83);
              auVar71 = vpmaddwd_avx2(auVar74,auVar59);
              auVar74 = vpsrad_avx2(auVar71,ZEXT416(uVar47));
              auVar71 = vpmaddwd_avx2(auVar69,auVar59);
              auVar71 = vpsrad_avx2(auVar71,ZEXT416(uVar47));
              auVar71 = vpackssdw_avx2(auVar74,auVar71);
              *(undefined1 (*) [32])(local_8060 + lVar30) = auVar71;
              lVar30 = lVar30 + 0x20;
              pauVar24 = (undefined1 (*) [32])(*pauVar24 + lVar39);
            } while (lVar30 != 0x200);
          }
          else {
            lVar30 = 0;
            pauVar24 = pauVar23;
            do {
              auVar71 = vlddqu_avx(*pauVar24);
              auVar71 = vpackssdw_avx2(auVar71,pauVar24[1]);
              auVar74 = vpermq_avx2(auVar71,0xd8);
              auVar71 = vpunpcklwd_avx2(auVar74,auVar83);
              auVar69 = vpunpckhwd_avx2(auVar74,auVar83);
              auVar71 = vpmaddwd_avx2(auVar71,auVar59);
              auVar74 = vpsrad_avx2(auVar71,ZEXT416(uVar47));
              auVar71 = vpmaddwd_avx2(auVar69,auVar59);
              auVar71 = vpsrad_avx2(auVar71,ZEXT416(uVar47));
              auVar71 = vpackssdw_avx2(auVar74,auVar71);
              *(undefined1 (*) [32])(local_8060 + lVar30) = auVar71;
              lVar30 = lVar30 + 0x20;
              pauVar24 = (undefined1 (*) [32])(*pauVar24 + lVar39);
            } while (lVar30 != 0x200);
          }
          transpose_16bit_16x16_avx2((__m256i *)local_8060,(__m256i *)local_8060);
          pauVar40 = (undefined1 (*) [16])
                     (output + uVar27 * 0x10 * (long)stride + local_8b60 * 0x10);
          bVar41 = pcVar5[1];
          uVar1 = (undefined2)tx_size_high_log2[CONCAT26(sStack_8b9c,(int6)iVar28) + 0x12];
          auVar60._2_2_ = uVar1;
          auVar60._0_2_ = uVar1;
          auVar60._4_2_ = uVar1;
          auVar60._6_2_ = uVar1;
          auVar60._8_2_ = uVar1;
          auVar60._10_2_ = uVar1;
          auVar60._12_2_ = uVar1;
          auVar60._14_2_ = uVar1;
          auVar60._16_2_ = uVar1;
          auVar60._18_2_ = uVar1;
          auVar60._20_2_ = uVar1;
          auVar60._22_2_ = uVar1;
          auVar60._24_2_ = uVar1;
          auVar60._26_2_ = uVar1;
          auVar60._28_2_ = uVar1;
          auVar60._30_2_ = uVar1;
          auVar71 = vpunpcklwd_avx2(auVar60,auVar58);
          iVar34 = 1 << (~bVar41 & 0x1f);
          auVar64._4_4_ = iVar34;
          auVar64._0_4_ = iVar34;
          auVar64._8_4_ = iVar34;
          auVar64._12_4_ = iVar34;
          auVar64._16_4_ = iVar34;
          auVar64._20_4_ = iVar34;
          auVar64._24_4_ = iVar34;
          auVar64._28_4_ = iVar34;
          lVar30 = 0;
          do {
            auVar74 = vpunpcklwd_avx2(*(undefined1 (*) [32])(local_8060 + lVar30),auVar83);
            auVar69 = vpunpckhwd_avx2(*(undefined1 (*) [32])(local_8060 + lVar30),auVar83);
            auVar74 = vpmaddwd_avx2(auVar74,auVar71);
            auVar69 = vpmaddwd_avx2(auVar69,auVar71);
            auVar74 = vpsrad_avx2(auVar74,0xc);
            auVar69 = vpsrad_avx2(auVar69,0xc);
            auVar74 = vpaddd_avx2(auVar74,auVar64);
            auVar69 = vpaddd_avx2(auVar69,auVar64);
            auVar65 = ZEXT416((uint)-(int)(char)bVar41);
            auVar74 = vpsrad_avx2(auVar74,auVar65);
            auVar88 = vpsrad_avx2(auVar69,auVar65);
            auVar69 = vpmovzxbw_avx2(*pauVar40);
            auVar74 = vpackssdw_avx2(auVar74,auVar88);
            auVar74 = vpaddsw_avx2(auVar69,auVar74);
            auVar65 = vpackuswb_avx(auVar74._0_16_,auVar74._16_16_);
            *pauVar40 = auVar65;
            pauVar40 = (undefined1 (*) [16])(*pauVar40 + stride);
            lVar30 = lVar30 + 0x20;
          } while (lVar30 != 0x200);
          uVar27 = uVar27 + 1;
          pauVar23 = pauVar23 + 2;
        } while (uVar27 != (uint)(iVar43 >> 4));
      }
      local_8b60 = local_8b60 + 1;
      local_8bd0 = local_8bd0 + (long)iVar43 * 2;
    } while (local_8b60 != (uint)(iVar33 >> 4));
    return;
  case 10:
  case 0xc:
  case 0xe:
    uVar47 = tx_size_wide[tx_size];
    uVar22 = 0x20;
    if ((int)uVar47 < 0x20) {
      uVar22 = uVar47;
    }
    if (eob < (int)uVar22) {
      iVar38 = eob_fill[eob + -1];
    }
    else {
      iVar38 = uVar22 - 1;
    }
    uVar31 = (ulong)((uint)tx_size * 4);
    uVar3 = *(uint *)((long)tx_size_high + uVar31);
    uVar32 = 0x20;
    if ((int)uVar3 < 0x20) {
      uVar32 = uVar3;
    }
    uVar44 = iVar38 + 0x10 >> 4;
    iVar38 = 0;
    if (uVar47 != uVar3) {
      if ((int)uVar3 < (int)uVar47) {
        iVar38 = 1;
        if ((uVar3 * 2 == uVar47) || (iVar38 = 2, uVar3 * 4 == uVar47)) goto LAB_00430f5b;
      }
      else {
        iVar38 = -1;
        if ((uVar47 * 2 == uVar3) || (iVar38 = -2, uVar47 << 2 == uVar3)) goto LAB_00430f5b;
      }
      iVar38 = 0;
    }
LAB_00430f5b:
    if ((int)uVar44 < 1) {
      return;
    }
    pcVar5 = av1_inv_txfm_shift_ls[tx_size];
    iVar28 = *(int *)((long)tx_size_wide_log2 + uVar31);
    uVar47 = eob_fill[(eob + -1) / (int)uVar22] + 0x10 >> 4;
    p_Var8 = lowbd_txfm_all_1d_zeros_w16_arr[(long)*(int *)((long)tx_size_high_log2 + uVar31) + -2]
             [""[uVar27]][lowbd_txfm_all_1d_zeros_idx[eob_fill[(eob + -1) / (int)uVar22]]];
    bVar41 = (byte)(tx_type - 4) >> 1;
    bVar50 = 5 < (byte)(bVar41 | tx_type << 7);
    bVar41 = 0x18 >> (bVar41 & 0x1f);
    lVar39 = (long)(int)uVar3 + -1;
    if ((bVar41 & 1) != 0 || bVar50) {
      lVar39 = 0;
    }
    uVar27 = 1;
    if (1 < (int)uVar3) {
      uVar27 = (ulong)uVar3;
    }
    uVar31 = 0;
    do {
      if (0 < (int)uVar47) {
        pauVar23 = (undefined1 (*) [32])(input + local_8b00);
        uVar51 = (undefined2)tx_size_high_log2[(long)iVar28 + 0x12];
        puVar26 = local_8060;
        uVar35 = 0;
        do {
          cVar2 = *pcVar5;
          uVar22 = 0xc - (int)cVar2;
          auVar16._2_2_ = uVar51;
          auVar16._0_2_ = uVar51;
          auVar16._4_2_ = uVar51;
          auVar16._6_2_ = uVar51;
          auVar16._8_2_ = uVar51;
          auVar16._10_2_ = uVar51;
          auVar16._12_2_ = uVar51;
          auVar16._14_2_ = uVar51;
          auVar65 = vpunpcklwd_avx(auVar16,ZEXT416((1 << (0xbU - cVar2 & 0x1f)) + 0x800));
          auVar54._0_4_ = auVar65._0_4_;
          auVar54._4_4_ = auVar54._0_4_;
          auVar54._8_4_ = auVar54._0_4_;
          auVar54._12_4_ = auVar54._0_4_;
          auVar54._16_4_ = auVar54._0_4_;
          auVar54._20_4_ = auVar54._0_4_;
          auVar54._24_4_ = auVar54._0_4_;
          auVar54._28_4_ = auVar54._0_4_;
          if ((iVar38 == -1) || (iVar38 == 1)) {
            lVar30 = 0;
            auVar15._8_2_ = 0x5a80;
            auVar15._0_8_ = 0x5a805a805a805a80;
            auVar15._10_2_ = 0x5a80;
            auVar15._12_2_ = 0x5a80;
            auVar15._14_2_ = 0x5a80;
            auVar15._16_2_ = 0x5a80;
            auVar15._18_2_ = 0x5a80;
            auVar15._20_2_ = 0x5a80;
            auVar15._22_2_ = 0x5a80;
            auVar15._24_2_ = 0x5a80;
            auVar15._26_2_ = 0x5a80;
            auVar15._28_2_ = 0x5a80;
            auVar15._30_2_ = 0x5a80;
            auVar19._8_2_ = 1;
            auVar19._0_8_ = 0x1000100010001;
            auVar19._10_2_ = 1;
            auVar19._12_2_ = 1;
            auVar19._14_2_ = 1;
            auVar19._16_2_ = 1;
            auVar19._18_2_ = 1;
            auVar19._20_2_ = 1;
            auVar19._22_2_ = 1;
            auVar19._24_2_ = 1;
            auVar19._26_2_ = 1;
            auVar19._28_2_ = 1;
            auVar19._30_2_ = 1;
            pauVar24 = pauVar23;
            do {
              auVar71 = vlddqu_avx(*pauVar24);
              auVar71 = vpackssdw_avx2(auVar71,pauVar24[1]);
              auVar71 = vpermq_avx2(auVar71,0xd8);
              auVar71 = vpmulhrsw_avx2(auVar71,auVar15);
              auVar74 = vpunpcklwd_avx2(auVar71,auVar19);
              auVar69 = vpunpckhwd_avx2(auVar71,auVar19);
              auVar71 = vpmaddwd_avx2(auVar74,auVar54);
              auVar74 = vpsrad_avx2(auVar71,ZEXT416(uVar22));
              auVar71 = vpmaddwd_avx2(auVar69,auVar54);
              auVar71 = vpsrad_avx2(auVar71,ZEXT416(uVar22));
              auVar71 = vpackssdw_avx2(auVar74,auVar71);
              *(undefined1 (*) [32])(puVar26 + lVar30) = auVar71;
              lVar30 = lVar30 + 0x20;
              pauVar24 = (undefined1 (*) [32])(*pauVar24 + (long)(int)uVar32 * 4);
            } while (lVar30 != 0x200);
          }
          else {
            lVar30 = 0;
            auVar20._8_2_ = 1;
            auVar20._0_8_ = 0x1000100010001;
            auVar20._10_2_ = 1;
            auVar20._12_2_ = 1;
            auVar20._14_2_ = 1;
            auVar20._16_2_ = 1;
            auVar20._18_2_ = 1;
            auVar20._20_2_ = 1;
            auVar20._22_2_ = 1;
            auVar20._24_2_ = 1;
            auVar20._26_2_ = 1;
            auVar20._28_2_ = 1;
            auVar20._30_2_ = 1;
            pauVar24 = pauVar23;
            do {
              auVar71 = vlddqu_avx(*pauVar24);
              auVar71 = vpackssdw_avx2(auVar71,pauVar24[1]);
              auVar74 = vpermq_avx2(auVar71,0xd8);
              auVar71 = vpunpcklwd_avx2(auVar74,auVar20);
              auVar69 = vpunpckhwd_avx2(auVar74,auVar20);
              auVar71 = vpmaddwd_avx2(auVar71,auVar54);
              auVar74 = vpsrad_avx2(auVar71,ZEXT416(uVar22));
              auVar71 = vpmaddwd_avx2(auVar69,auVar54);
              auVar71 = vpsrad_avx2(auVar71,ZEXT416(uVar22));
              auVar71 = vpackssdw_avx2(auVar74,auVar71);
              *(undefined1 (*) [32])(puVar26 + lVar30) = auVar71;
              lVar30 = lVar30 + 0x20;
              pauVar24 = (undefined1 (*) [32])(*pauVar24 + (long)(int)uVar32 * 4);
            } while (lVar30 != 0x200);
          }
          transpose_16bit_16x16_avx2
                    ((__m256i *)(local_8060 + uVar35 * 0x200),
                     (__m256i *)(local_8060 + uVar35 * 0x200));
          uVar35 = uVar35 + 1;
          puVar26 = puVar26 + 0x200;
          pauVar23 = pauVar23 + 2;
        } while (uVar35 != uVar47);
      }
      (*p_Var8)((__m256i *)local_8060,(__m256i *)local_8060);
      auVar55._0_2_ = (undefined2)(1 << (pcVar5[1] + 0xfU & 0x1f));
      auVar55._2_2_ = auVar55._0_2_;
      auVar55._4_2_ = auVar55._0_2_;
      auVar55._6_2_ = auVar55._0_2_;
      auVar55._8_2_ = auVar55._0_2_;
      auVar55._10_2_ = auVar55._0_2_;
      auVar55._12_2_ = auVar55._0_2_;
      auVar55._14_2_ = auVar55._0_2_;
      auVar55._16_2_ = auVar55._0_2_;
      auVar55._18_2_ = auVar55._0_2_;
      auVar55._20_2_ = auVar55._0_2_;
      auVar55._22_2_ = auVar55._0_2_;
      auVar55._24_2_ = auVar55._0_2_;
      auVar55._26_2_ = auVar55._0_2_;
      auVar55._28_2_ = auVar55._0_2_;
      auVar55._30_2_ = auVar55._0_2_;
      pauVar40 = (undefined1 (*) [16])output;
      uVar35 = uVar27;
      pauVar23 = (undefined1 (*) [32])(local_8060 + lVar39 * 0x20);
      do {
        auVar74 = vpmulhrsw_avx2(auVar55,*pauVar23);
        auVar71 = vpmovzxbw_avx2(*pauVar40);
        auVar71 = vpaddsw_avx2(auVar71,auVar74);
        auVar65 = vpackuswb_avx(auVar71._0_16_,auVar71._16_16_);
        *pauVar40 = auVar65;
        pauVar23 = (undefined1 (*) [32])(pauVar23[-1] + (((bVar41 | bVar50) & 1) << 6));
        pauVar40 = (undefined1 (*) [16])(*pauVar40 + stride);
        uVar35 = uVar35 - 1;
      } while (uVar35 != 0);
      uVar31 = uVar31 + 1;
      local_8b00 = local_8b00 + uVar32 * 0x10;
      output = (uint8_t *)((long)output + 0x10);
    } while (uVar31 != uVar44);
    return;
  case 0xb:
  case 0xd:
  case 0xf:
    uVar47 = tx_size_high[tx_size];
    uVar22 = 0x20;
    if ((int)uVar47 < 0x20) {
      uVar22 = uVar47;
    }
    if (eob < (int)uVar22) {
      iVar38 = eob_fill[eob + -1];
    }
    else {
      iVar38 = uVar22 - 1;
    }
    uVar31 = (ulong)((uint)tx_size * 4);
    uVar3 = *(uint *)((long)tx_size_wide + uVar31);
    uVar32 = iVar38 + 0x10 >> 4;
    local_8be8 = 0;
    if (uVar3 != uVar47) {
      if ((int)uVar47 < (int)uVar3) {
        local_8be8 = 1;
        if ((uVar47 * 2 == uVar3) || (local_8be8 = 2, uVar47 << 2 == uVar3)) goto LAB_00431341;
      }
      else {
        local_8be8 = -1;
        if ((uVar3 * 2 == uVar47) || (local_8be8 = -2, uVar3 * 4 == uVar47)) goto LAB_00431341;
      }
      local_8be8 = 0;
    }
LAB_00431341:
    if ((int)uVar32 < 1) {
      return;
    }
    pbVar7 = (byte *)av1_inv_txfm_shift_ls[tx_size];
    iVar38 = *(int *)((long)tx_size_high_log2 + uVar31);
    uVar44 = (int)uVar3 >> 4;
    uVar47 = (eob_fill[(eob + -1) / (int)uVar22] & 0xfffffff8U) + 8;
    p_Var8 = lowbd_txfm_all_1d_zeros_w16_arr[(long)*(int *)((long)tx_size_wide_log2 + uVar31) + -2]
             [""[uVar27]][lowbd_txfm_all_1d_zeros_idx[eob_fill[(eob + -1) / (int)uVar22]]];
    uVar31 = (ulong)uVar44;
    uVar27 = 0;
    auVar62._8_2_ = 0x5a80;
    auVar62._0_8_ = 0x5a805a805a805a80;
    auVar62._10_2_ = 0x5a80;
    auVar62._12_2_ = 0x5a80;
    auVar62._14_2_ = 0x5a80;
    auVar62._16_2_ = 0x5a80;
    auVar62._18_2_ = 0x5a80;
    auVar62._20_2_ = 0x5a80;
    auVar62._22_2_ = 0x5a80;
    auVar62._24_2_ = 0x5a80;
    auVar62._26_2_ = 0x5a80;
    auVar62._28_2_ = 0x5a80;
    auVar62._30_2_ = 0x5a80;
    local_8a80._8_2_ = 0x800;
    local_8a80._0_8_ = 0x800080008000800;
    local_8a80._10_2_ = 0x800;
    local_8a80._12_2_ = 0x800;
    local_8a80._14_2_ = 0x800;
    local_8a80._16_2_ = 0x800;
    local_8a80._18_2_ = 0x800;
    local_8a80._20_2_ = 0x800;
    local_8a80._22_2_ = 0x800;
    local_8a80._24_2_ = 0x800;
    local_8a80._26_2_ = 0x800;
    local_8a80._28_2_ = 0x800;
    local_8a80._30_2_ = 0x800;
    auVar82._8_2_ = 1;
    auVar82._0_8_ = 0x1000100010001;
    auVar82._10_2_ = 1;
    auVar82._12_2_ = 1;
    auVar82._14_2_ = 1;
    auVar82._16_2_ = 1;
    auVar82._18_2_ = 1;
    auVar82._20_2_ = 1;
    auVar82._22_2_ = 1;
    auVar82._24_2_ = 1;
    auVar82._26_2_ = 1;
    auVar82._28_2_ = 1;
    auVar82._30_2_ = 1;
    do {
      palVar36 = (__m256i *)local_8a60;
      uVar35 = (ulong)uVar47;
      pauVar23 = (undefined1 (*) [32])input;
      palVar25 = palVar36;
      do {
        auVar71 = vlddqu_avx(*pauVar23);
        auVar71 = vpackssdw_avx2(auVar71,pauVar23[1]);
        alVar9 = (__m256i)vpermq_avx2(auVar71,0xd8);
        *palVar25 = alVar9;
        palVar25 = palVar25 + 1;
        pauVar23 = (undefined1 (*) [32])(*pauVar23 + (long)(int)uVar22 * 4);
        uVar35 = uVar35 - 1;
      } while (uVar35 != 0);
      if ((local_8be8 == 1) || (local_8be8 == -1)) {
        uVar35 = (ulong)uVar47;
        palVar25 = palVar36;
        do {
          alVar9 = (__m256i)vpmulhrsw_avx2(auVar62,(undefined1  [32])*palVar25);
          *palVar25 = alVar9;
          palVar25 = palVar25 + 1;
          uVar35 = uVar35 - 1;
        } while (uVar35 != 0);
      }
      (*p_Var8)(palVar36,palVar36);
      bVar41 = *pbVar7;
      if ((char)bVar41 < '\0') {
        auVar56._0_2_ = (undefined2)(1 << (~bVar41 & 0x1f));
        auVar56._2_2_ = auVar56._0_2_;
        auVar56._4_2_ = auVar56._0_2_;
        auVar56._6_2_ = auVar56._0_2_;
        auVar56._8_2_ = auVar56._0_2_;
        auVar56._10_2_ = auVar56._0_2_;
        auVar56._12_2_ = auVar56._0_2_;
        auVar56._14_2_ = auVar56._0_2_;
        auVar56._16_2_ = auVar56._0_2_;
        auVar56._18_2_ = auVar56._0_2_;
        auVar56._20_2_ = auVar56._0_2_;
        auVar56._22_2_ = auVar56._0_2_;
        auVar56._24_2_ = auVar56._0_2_;
        auVar56._26_2_ = auVar56._0_2_;
        auVar56._28_2_ = auVar56._0_2_;
        auVar56._30_2_ = auVar56._0_2_;
        palVar25 = palVar36;
        uVar35 = (ulong)uVar3;
        do {
          auVar71 = vpaddsw_avx2(auVar56,(undefined1  [32])*palVar25);
          alVar9 = (__m256i)vpsraw_avx2(auVar71,ZEXT416((uint)-(int)(char)bVar41));
          *palVar25 = alVar9;
          palVar25 = palVar25 + 1;
          uVar35 = uVar35 - 1;
        } while (uVar35 != 0);
      }
      else {
        palVar25 = palVar36;
        uVar35 = (ulong)uVar3;
        if (bVar41 != 0) {
          do {
            alVar9 = (__m256i)vpsllw_avx2((undefined1  [32])*palVar25,
                                          ZEXT416((uint)(int)(char)bVar41));
            *palVar25 = alVar9;
            uVar35 = uVar35 - 1;
            palVar25 = palVar25 + 1;
          } while (uVar35 != 0);
        }
      }
      if (tx_type < 0x10 && (0x7f1fU >> (tx_type & 0x1f) & 1) == 0) {
        if (0 < (int)uVar44) {
          uVar35 = 0;
          do {
            lVar39 = 0x200;
            palVar25 = palVar36;
            do {
              lVar12 = (*palVar25)[1];
              lVar13 = (*palVar25)[2];
              lVar14 = (*palVar25)[3];
              *(longlong *)((long)alStack_8280 + lVar39) = (*palVar25)[0];
              *(longlong *)((long)alStack_8280 + lVar39 + 8) = lVar12;
              *(longlong *)((long)alStack_8280 + lVar39 + 0x10) = lVar13;
              *(longlong *)((long)alStack_8280 + lVar39 + 0x18) = lVar14;
              palVar25 = palVar25 + 1;
              lVar39 = lVar39 + -0x20;
            } while (lVar39 != 0);
            transpose_16bit_16x16_avx2
                      ((__m256i *)(alStack_8280 + 4),
                       (__m256i *)(local_8060 + (~uVar35 + uVar31) * 0x200));
            uVar35 = uVar35 + 1;
            palVar36 = palVar36 + 0x10;
          } while (uVar35 != uVar31);
          goto LAB_004315f1;
        }
      }
      else if (0 < (int)uVar44) {
        palVar25 = (__m256i *)local_8060;
        uVar35 = uVar31;
        do {
          transpose_16bit_16x16_avx2(palVar36,palVar25);
          palVar25 = palVar25 + 0x10;
          palVar36 = palVar36 + 0x10;
          uVar35 = uVar35 - 1;
        } while (uVar35 != 0);
LAB_004315f1:
        if (0 < (int)uVar44) {
          uVar51 = (undefined2)tx_size_high_log2[(long)iVar38 + 0x12];
          auVar57._2_2_ = uVar51;
          auVar57._0_2_ = uVar51;
          auVar57._4_2_ = uVar51;
          auVar57._6_2_ = uVar51;
          auVar57._8_2_ = uVar51;
          auVar57._10_2_ = uVar51;
          auVar57._12_2_ = uVar51;
          auVar57._14_2_ = uVar51;
          auVar57._16_2_ = uVar51;
          auVar57._18_2_ = uVar51;
          auVar57._20_2_ = uVar51;
          auVar57._22_2_ = uVar51;
          auVar57._24_2_ = uVar51;
          auVar57._26_2_ = uVar51;
          auVar57._28_2_ = uVar51;
          auVar57._30_2_ = uVar51;
          auVar71 = vpunpcklwd_avx2(auVar57,local_8a80);
          puVar26 = local_8060;
          uVar35 = 0;
          do {
            pauVar40 = (undefined1 (*) [16])(output + uVar35 * 0x10 + uVar27 * 0x10 * (long)stride);
            bVar41 = pbVar7[1];
            iVar28 = 1 << (~bVar41 & 0x1f);
            auVar63._4_4_ = iVar28;
            auVar63._0_4_ = iVar28;
            auVar63._8_4_ = iVar28;
            auVar63._12_4_ = iVar28;
            auVar63._16_4_ = iVar28;
            auVar63._20_4_ = iVar28;
            auVar63._24_4_ = iVar28;
            auVar63._28_4_ = iVar28;
            lVar39 = 0;
            do {
              auVar74 = vpunpcklwd_avx2(*(undefined1 (*) [32])(puVar26 + lVar39),auVar82);
              auVar69 = vpunpckhwd_avx2(*(undefined1 (*) [32])(puVar26 + lVar39),auVar82);
              auVar74 = vpmaddwd_avx2(auVar74,auVar71);
              auVar69 = vpmaddwd_avx2(auVar69,auVar71);
              auVar74 = vpsrad_avx2(auVar74,0xc);
              auVar69 = vpsrad_avx2(auVar69,0xc);
              auVar74 = vpaddd_avx2(auVar74,auVar63);
              auVar69 = vpaddd_avx2(auVar69,auVar63);
              auVar65 = ZEXT416((uint)-(int)(char)bVar41);
              auVar74 = vpsrad_avx2(auVar74,auVar65);
              auVar88 = vpsrad_avx2(auVar69,auVar65);
              auVar69 = vpmovzxbw_avx2(*pauVar40);
              auVar74 = vpackssdw_avx2(auVar74,auVar88);
              auVar74 = vpaddsw_avx2(auVar69,auVar74);
              auVar65 = vpackuswb_avx(auVar74._0_16_,auVar74._16_16_);
              *pauVar40 = auVar65;
              pauVar40 = (undefined1 (*) [16])(*pauVar40 + stride);
              lVar39 = lVar39 + 0x20;
            } while (lVar39 != 0x200);
            uVar35 = uVar35 + 1;
            puVar26 = puVar26 + 0x200;
          } while (uVar35 != uVar31);
        }
      }
      uVar27 = uVar27 + 1;
      input = (int32_t *)((long)input + 0x40);
      if (uVar27 == uVar32) {
        return;
      }
    } while( true );
  default:
switchD_004304df_default:
    av1_lowbd_inv_txfm2d_add_ssse3(input,output,stride,tx_type,tx_size,eob);
    return;
  }
  local_8ba0 = 0;
  uStack_8b9f = 0;
  uStack_8b9e = 0;
  uVar47 = 0;
  iVar38 = 0;
  if (eob != 1) {
    uVar47 = (int)av1_eob_to_eobxy_default[tx_size]
                  [eob + -1 >> (*(byte *)(tx_size_wide_log2_eob + tx_size) & 0x1f)] & 0xff;
    iVar38 = (int)av1_eob_to_eobxy_default[tx_size]
                  [eob + -1 >> (*(byte *)(tx_size_wide_log2_eob + tx_size) & 0x1f)] >> 8;
  }
  pcVar5 = av1_inv_txfm_shift_ls[tx_size];
  uVar22 = tx_size_wide[tx_size];
  uVar31 = (ulong)uVar22;
  uVar3 = tx_size_high[tx_size];
  uVar44 = (int)uVar22 >> 4;
  uVar21 = iVar38 + 0x10 >> 4;
  uVar32 = 0x20;
  if ((int)uVar3 < 0x20) {
    uVar32 = uVar3;
  }
  if (uVar22 == uVar3) goto LAB_0043059f;
  if ((int)uVar3 < (int)uVar22) {
    local_8ba0 = 1;
    uStack_8b9f = 0;
    uStack_8b9e = 0;
    if (uVar3 * 2 == uVar22) goto LAB_0043059f;
    local_8ba0 = 2;
    uStack_8b9f = 0;
    uStack_8b9e = 0;
    if (uVar3 * 4 == uVar22) goto LAB_0043059f;
  }
  else {
    local_8ba0 = 0xff;
    uStack_8b9f = 0xff;
    uStack_8b9e = 0xffff;
    if (uVar22 * 2 == uVar3) goto LAB_0043059f;
    local_8ba0 = 0xfe;
    uStack_8b9f = 0xff;
    uStack_8b9e = 0xffff;
    if (uVar22 * 4 == uVar3) goto LAB_0043059f;
  }
  local_8ba0 = 0;
  uStack_8b9f = 0;
  uStack_8b9e = 0;
LAB_0043059f:
  sStack_8b7c = (short)((int)uVar3 >> 0x1f);
  bVar50 = 0xf < tx_type;
  uVar37 = 0xbeaf >> (tx_type & 0x1f);
  p_Var8 = lowbd_txfm_all_1d_zeros_w16_arr[(long)tx_size_high_log2[tx_size] + -2][""[uVar27]]
           [lowbd_txfm_all_1d_zeros_idx[iVar38]];
  uVar35 = (ulong)uVar44;
  if (0 < (int)uVar21) {
    p_Var4 = lowbd_txfm_all_1d_zeros_w16_arr[(long)tx_size_wide_log2[tx_size] + -2][""[uVar27]]
             [lowbd_txfm_all_1d_zeros_idx[uVar47]];
    local_8aa0._2_2_ = (undefined2)(1 << (*pcVar5 + 0xfU & 0x1f));
    if ((int)uVar22 < 2) {
      uVar31 = 1;
    }
    local_8ae0 = (undefined2)uVar44;
    sStack_8ade = (short)((int)uVar22 >> 0x14);
    sStack_8adc = (short)((int)uVar22 >> 0xf);
    lVar39 = (ulong)((uVar47 & 0xf0) << 5) + 0x200;
    palVar25 = (__m256i *)local_8060;
    uVar27 = 0;
    auVar66._8_2_ = 0x5a80;
    auVar66._0_8_ = 0x5a805a805a805a80;
    auVar66._10_2_ = 0x5a80;
    auVar66._12_2_ = 0x5a80;
    auVar66._14_2_ = 0x5a80;
    auVar66._16_2_ = 0x5a80;
    auVar66._18_2_ = 0x5a80;
    auVar66._20_2_ = 0x5a80;
    auVar66._22_2_ = 0x5a80;
    auVar66._24_2_ = 0x5a80;
    auVar66._26_2_ = 0x5a80;
    auVar66._28_2_ = 0x5a80;
    auVar66._30_2_ = 0x5a80;
    local_8aa0._0_2_ = local_8aa0._2_2_;
    local_8aa0._4_2_ = local_8aa0._2_2_;
    local_8aa0._6_2_ = local_8aa0._2_2_;
    local_8aa0._8_2_ = local_8aa0._2_2_;
    local_8aa0._10_2_ = local_8aa0._2_2_;
    local_8aa0._12_2_ = local_8aa0._2_2_;
    local_8aa0._14_2_ = local_8aa0._2_2_;
    local_8aa0._16_2_ = local_8aa0._2_2_;
    local_8aa0._18_2_ = local_8aa0._2_2_;
    local_8aa0._20_2_ = local_8aa0._2_2_;
    local_8aa0._22_2_ = local_8aa0._2_2_;
    local_8aa0._24_2_ = local_8aa0._2_2_;
    local_8aa0._26_2_ = local_8aa0._2_2_;
    local_8aa0._28_2_ = local_8aa0._2_2_;
    local_8aa0._30_2_ = local_8aa0._2_2_;
    do {
      lVar30 = 0;
      pauVar23 = (undefined1 (*) [32])input;
      do {
        auVar71 = vlddqu_avx(*pauVar23);
        auVar71 = vpackssdw_avx2(auVar71,pauVar23[1]);
        auVar71 = vpermq_avx2(auVar71,0xd8);
        *(undefined1 (*) [32])(local_8a60 + lVar30) = auVar71;
        lVar30 = lVar30 + 0x20;
        pauVar23 = (undefined1 (*) [32])(*pauVar23 + (long)(int)uVar32 * 4);
      } while (lVar39 != lVar30);
      if ((CONCAT22(uStack_8b9e,CONCAT11(uStack_8b9f,local_8ba0)) == 1) ||
         (CONCAT22(uStack_8b9e,CONCAT11(uStack_8b9f,local_8ba0)) == -1)) {
        lVar30 = 0;
        do {
          auVar71 = vpmulhrsw_avx2(auVar66,*(undefined1 (*) [32])(local_8a60 + lVar30));
          *(undefined1 (*) [32])(local_8a60 + lVar30) = auVar71;
          lVar30 = lVar30 + 0x20;
        } while (lVar39 != lVar30);
      }
      (*p_Var4)((__m256i *)local_8a60,(__m256i *)local_8a60);
      lVar30 = 0;
      do {
        auVar71 = vpmulhrsw_avx2(local_8aa0,*(undefined1 (*) [32])(local_8a60 + lVar30));
        *(undefined1 (*) [32])(local_8a60 + lVar30) = auVar71;
        lVar30 = lVar30 + 0x20;
      } while (uVar31 << 5 != lVar30);
      if ((0x7f1fU >> (tx_type & 0x1f) & 1) == 0 && !bVar50) {
        if (0 < (int)uVar44) {
          puVar46 = (undefined8 *)local_8a60;
          uVar48 = 0;
          do {
            lVar30 = 0x200;
            puVar29 = puVar46;
            do {
              uVar6 = puVar29[1];
              uVar10 = puVar29[2];
              uVar11 = puVar29[3];
              *(undefined8 *)((long)alStack_8280 + lVar30) = *puVar29;
              *(undefined8 *)((long)alStack_8280 + lVar30 + 8) = uVar6;
              *(undefined8 *)((long)alStack_8280 + lVar30 + 0x10) = uVar10;
              *(undefined8 *)((long)alStack_8280 + lVar30 + 0x18) = uVar11;
              puVar29 = puVar29 + 4;
              lVar30 = lVar30 + -0x20;
            } while (lVar30 != 0);
            transpose_16bit_16x16_avx2
                      ((__m256i *)(alStack_8280 + 4),
                       (__m256i *)
                       (local_8060 +
                       (~uVar48 +
                       CONCAT26(sStack_8adc,CONCAT24(sStack_8adc,CONCAT22(sStack_8ade,local_8ae0))))
                       * CONCAT26(sStack_8b7c,(int6)(int)uVar3) * 0x20 + uVar27 * 0x200));
            uVar48 = uVar48 + 1;
            puVar46 = puVar46 + 0x40;
          } while (uVar48 != uVar35);
        }
      }
      else if (0 < (int)uVar44) {
        palVar36 = (__m256i *)local_8a60;
        out = palVar25;
        uVar48 = uVar35;
        do {
          transpose_16bit_16x16_avx2(palVar36,out);
          out = out + CONCAT26(sStack_8b7c,(int6)(int)uVar3);
          palVar36 = palVar36 + 0x10;
          uVar48 = uVar48 - 1;
        } while (uVar48 != 0);
      }
      uVar27 = uVar27 + 1;
      input = (int32_t *)((long)input + 0x40);
      palVar25 = palVar25 + 0x10;
    } while (uVar27 != uVar21);
  }
  lVar39 = CONCAT26(sStack_8b7c,(int6)(int)uVar3);
  if ((int)uVar44 < 1) {
    return;
  }
  uVar51 = (undefined2)(1 << (pcVar5[1] + 0xfU & 0x1f));
  uVar27 = 1;
  if (1 < (int)uVar3) {
    uVar27 = (ulong)(uint6)(int6)(int)uVar3 & 0xffffffff;
  }
  puVar26 = local_8060;
  uVar31 = 0;
  do {
    (*p_Var8)((__m256i *)(local_8060 + uVar31 * CONCAT26(sStack_8b7c,(int6)(int)uVar3) * 0x20),
              (__m256i *)(local_8060 + uVar31 * CONCAT26(sStack_8b7c,(int6)(int)uVar3) * 0x20));
    auVar17._2_2_ = uVar51;
    auVar17._0_2_ = uVar51;
    auVar17._4_2_ = uVar51;
    auVar17._6_2_ = uVar51;
    auVar17._8_2_ = uVar51;
    auVar17._10_2_ = uVar51;
    auVar17._12_2_ = uVar51;
    auVar17._14_2_ = uVar51;
    auVar17._16_2_ = uVar51;
    auVar17._18_2_ = uVar51;
    auVar17._20_2_ = uVar51;
    auVar17._22_2_ = uVar51;
    auVar17._24_2_ = uVar51;
    auVar17._26_2_ = uVar51;
    auVar17._28_2_ = uVar51;
    auVar17._30_2_ = uVar51;
    lVar30 = 0;
    do {
      auVar71 = vpmulhrsw_avx2(auVar17,*(undefined1 (*) [32])(puVar26 + lVar30));
      *(undefined1 (*) [32])(puVar26 + lVar30) = auVar71;
      lVar30 = lVar30 + 0x20;
    } while (uVar27 * 0x20 != lVar30);
    uVar31 = uVar31 + 1;
    puVar26 = puVar26 + lVar39 * 0x20;
  } while (uVar31 != uVar35);
  lVar30 = CONCAT26(sStack_8b7c,(int6)(int)uVar3);
  uVar31 = 0;
  uVar27 = lVar30 - 1;
  if (bVar50 || (uVar37 & 1) != 0) {
    uVar27 = uVar31;
  }
  pauVar24 = (undefined1 (*) [32])(local_8060 + uVar27 * 0x20);
  lVar42 = lVar30;
  pauVar40 = (undefined1 (*) [16])output;
  pauVar23 = pauVar24;
  do {
    do {
      auVar71 = vpmovzxbw_avx2(*(undefined1 (*) [16])output);
      auVar71 = vpaddsw_avx2(auVar71,*pauVar24);
      auVar65 = vpackuswb_avx(auVar71._0_16_,auVar71._16_16_);
      *(undefined1 (*) [16])output = auVar65;
      pauVar24 = (undefined1 (*) [32])(pauVar24[-1] + (((byte)(bVar50 | (byte)uVar37) & 1) << 6));
      output = *(undefined1 (*) [16])output + stride;
      lVar42 = lVar42 + -1;
    } while (lVar42 != 0);
    uVar31 = uVar31 + 1;
    pauVar24 = pauVar23 + lVar39;
    output = (uint8_t *)(pauVar40 + 1);
    lVar42 = lVar30;
    pauVar40 = (undefined1 (*) [16])output;
    pauVar23 = pauVar24;
  } while (uVar31 != uVar35);
  return;
}

Assistant:

void av1_lowbd_inv_txfm2d_add_avx2(const int32_t *input, uint8_t *output,
                                   int stride, TX_TYPE tx_type, TX_SIZE tx_size,
                                   int eob) {
  switch (tx_size) {
    case TX_4X4:
    case TX_4X8:
    case TX_8X4:
    case TX_8X16:
    case TX_16X8:
    case TX_4X16:
    case TX_16X4:
    case TX_8X32:
    case TX_32X8:
      av1_lowbd_inv_txfm2d_add_ssse3(input, output, stride, tx_type, tx_size,
                                     eob);
      break;
    case TX_8X8:
      lowbd_inv_txfm2d_add_8x8_avx2(input, output, stride, tx_type, tx_size,
                                    eob);
      break;
    case TX_16X16:
    case TX_32X32:
    case TX_64X64:
    case TX_16X32:
    case TX_32X16:
    case TX_32X64:
    case TX_64X32:
    case TX_16X64:
    case TX_64X16:
    default:
      lowbd_inv_txfm2d_add_universe_avx2(input, output, stride, tx_type,
                                         tx_size, eob);
      break;
  }
}